

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O1

UMutableCPTrie * umutablecptrie_fromUCPMap_63(UCPMap *map,UErrorCode *pErrorCode)

{
  uint32_t errValue;
  uint32_t iniValue;
  uint end;
  MutableCodePointTrie *this;
  MutableCodePointTrie *p;
  MutableCodePointTrie *pMVar1;
  void *p_00;
  uint start;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> mutableTrie;
  MutableCodePointTrie *local_40;
  uint32_t local_34;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UMutableCPTrie *)0x0;
  }
  if (map == (UCPMap *)0x0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UMutableCPTrie *)0x0;
  }
  errValue = ucpmap_get_63(map,-1);
  p_00 = (void *)((long)&__DT_SYMTAB[0x13d].st_size + 7);
  iniValue = ucpmap_get_63(map,0x10ffff);
  this = (MutableCodePointTrie *)icu_63::UMemory::operator_new((UMemory *)0x11040,(size_t)p_00);
  if (this == (MutableCodePointTrie *)0x0) {
    this = (MutableCodePointTrie *)0x0;
  }
  else {
    p_00 = (void *)(ulong)iniValue;
    icu_63::anon_unknown_0::MutableCodePointTrie::MutableCodePointTrie
              (this,iniValue,errValue,pErrorCode);
  }
  if ((this == (MutableCodePointTrie *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  start = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    while( true ) {
      p_00 = (void *)(ulong)start;
      end = ucpmap_getRange_63(map,start,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,(void *)0x0,
                               &local_34);
      if ((int)end < 0) break;
      if (local_34 != iniValue) {
        if (start == end) {
          icu_63::anon_unknown_0::MutableCodePointTrie::set(this,start,local_34,pErrorCode);
        }
        else {
          icu_63::anon_unknown_0::MutableCodePointTrie::setRange(this,start,end,local_34,pErrorCode)
          ;
        }
      }
      start = end + 1;
    }
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      local_40 = (MutableCodePointTrie *)0x0;
      pMVar1 = this;
      goto LAB_002d7d1b;
    }
  }
  pMVar1 = (MutableCodePointTrie *)0x0;
  local_40 = this;
LAB_002d7d1b:
  if (local_40 != (MutableCodePointTrie *)0x0) {
    icu_63::anon_unknown_0::MutableCodePointTrie::~MutableCodePointTrie(local_40);
    icu_63::UMemory::operator_delete((UMemory *)local_40,p_00);
    return (UMutableCPTrie *)pMVar1;
  }
  return (UMutableCPTrie *)pMVar1;
}

Assistant:

int32_t getAllSameOverlap(const uint32_t *p, int32_t length, uint32_t value,
                          int32_t blockLength) {
    int32_t min = length - (blockLength - 1);
    int32_t i = length;
    while (min < i && p[i - 1] == value) { --i; }
    return length - i;
}